

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O3

bool __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundLiteral(FiniteModelMultiSorted *this,Literal *lit)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int *__s;
  OperatorType *pOVar4;
  TermList TVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint *res;
  DArray<unsigned_int> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  string local_138;
  Literal *local_118;
  ulong local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong local_e8;
  ulong local_e0;
  int *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = (ulong)*(uint *)(*(long *)(*(long *)(DAT_00b521b0 + 0x80) +
                                    (long)(int)(lit->super_Term)._functor * 8) + 0x20);
  local_e8 = uVar6;
  local_e0 = uVar6;
  if (uVar6 == 0) {
    local_d8 = (int *)0x0;
    __s = (int *)0x0;
  }
  else {
    uVar13 = uVar6 * 4 + 0xf & 0x7fffffff0;
    if (uVar13 == 0) {
      __s = (int *)Lib::FixedSizeAllocator<8UL>::alloc
                             ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar13 < 0x11) {
      __s = (int *)Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar13 < 0x19) {
      __s = (int *)Lib::FixedSizeAllocator<24UL>::alloc
                             ((FixedSizeAllocator<24UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar13 < 0x21) {
      __s = (int *)Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar13 < 0x31) {
      __s = (int *)Lib::FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar13 < 0x41) {
      __s = (int *)Lib::FixedSizeAllocator<64UL>::alloc
                             ((FixedSizeAllocator<64UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (int *)::operator_new(uVar13,0x10);
    }
    iVar12 = 0;
    memset(__s,0,uVar6 * 4);
    uVar13 = 0;
    local_d8 = __s;
    do {
      uVar3 = evaluateGroundTerm(this,(Term *)(lit->super_Term)._args
                                              [(int)((*(uint *)&(lit->super_Term).field_0xc &
                                                     0xfffffff) + iVar12)]._content);
      __s[uVar13] = uVar3;
      if (uVar3 == 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x50);
        Kernel::Literal::toString_abi_cxx11_(&local_b0,lit);
        std::operator+(&local_50,"Could not evaluate ",&local_b0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_138._M_dataplus._M_p = (pointer)*plVar8;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_138._M_dataplus._M_p == psVar9) {
          local_138.field_2._M_allocated_capacity = *psVar9;
          local_138.field_2._8_8_ = plVar8[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar9;
        }
        local_138._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        Kernel::Term::toString_abi_cxx11_
                  (&local_70,
                   (Term *)(lit->super_Term)._args
                           [(int)((*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - (int)uVar13)
                           ]._content,true);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       in_stack_fffffffffffffeb8);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_90 = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (local_90 == plVar10) {
          local_80 = *plVar10;
          uStack_78 = (undefined4)plVar8[3];
          uStack_74 = *(undefined4 *)((long)plVar8 + 0x1c);
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar10;
        }
        local_88 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        *puVar7 = &PTR_cry_00b3dfc0;
        puVar7[1] = puVar7 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar7 + 1),local_90,local_88 + (long)local_90);
        *puVar7 = &PTR_cry_00b3e0a8;
        *(undefined4 *)(puVar7 + 5) = 0;
        puVar7[6] = puVar7 + 8;
        puVar7[7] = 0;
        *(undefined1 *)(puVar7 + 8) = 0;
        __cxa_throw(puVar7,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      uVar13 = uVar13 + 1;
      iVar12 = iVar12 + -1;
    } while (uVar6 != uVar13);
  }
  uVar13 = (ulong)(lit->super_Term)._functor;
  if (uVar13 == 0) {
    bVar11 = (((lit->super_Term)._args[0]._content & 4) == 0) != (*__s == __s[1]);
  }
  else {
    pOVar4 = Kernel::Signature::Symbol::predType
                       (*(Symbol **)(*(long *)(DAT_00b521b0 + 0x80) + uVar13 * 8));
    uVar3 = (this->_p_offsets)._array[(lit->super_Term)._functor];
    local_118 = lit;
    local_110 = uVar6;
    if (uVar6 != 0) {
      iVar12 = 1;
      lVar14 = 0;
      do {
        iVar2 = __s[lVar14];
        if ((uint)lVar14 < pOVar4->_typeArgsArity) {
          TVar5 = Kernel::AtomicSort::superSort();
        }
        else {
          TVar5._content =
               *(uint64_t *)(pOVar4->_key + (ulong)((uint)lVar14 - pOVar4->_typeArgsArity) * 8 + 8);
        }
        uVar3 = uVar3 + (iVar2 + -1) * iVar12;
        iVar12 = iVar12 * (this->_sizes)._array[*(uint *)(TVar5._content + 8)];
        lVar14 = lVar14 + 1;
      } while ((uint)lVar14 < (uint)local_110);
    }
    cVar1 = (this->_p_interpretation)._array[uVar3];
    if (cVar1 == '\0') {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(&local_138,local_118);
      std::operator+(&local_108,"Could not evaluate ",&local_138);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_d0 = (long *)*plVar8;
      plVar10 = plVar8 + 2;
      if (local_d0 == plVar10) {
        local_c0 = *plVar10;
        uStack_b8 = (undefined4)plVar8[3];
        uStack_b4 = *(undefined4 *)((long)plVar8 + 0x1c);
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar10;
      }
      local_c8 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      *puVar7 = &PTR_cry_00b3dfc0;
      puVar7[1] = puVar7 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar7 + 1),local_d0,local_c8 + (long)local_d0);
      *puVar7 = &PTR_cry_00b3e0a8;
      *(undefined4 *)(puVar7 + 5) = 0;
      puVar7[6] = puVar7 + 8;
      puVar7[7] = 0;
      *(undefined1 *)(puVar7 + 8) = 0;
      __cxa_throw(puVar7,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    bVar11 = (((local_118->super_Term)._args[0]._content & 4) == 0) != (cVar1 == '\x02');
    uVar6 = local_110;
    if (__s == (int *)0x0) {
      return bVar11;
    }
  }
  uVar6 = uVar6 * 4 + 0xf & 0x7fffffff0;
  if (uVar6 == 0) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = __s;
  }
  else if (uVar6 < 0x11) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = __s;
  }
  else if (uVar6 < 0x19) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = __s;
  }
  else if (uVar6 < 0x21) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = __s;
  }
  else if (uVar6 < 0x31) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = __s;
  }
  else if (uVar6 < 0x41) {
    *(undefined8 *)__s = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = __s;
  }
  else {
    operator_delete(__s,0x10);
  }
  return bVar11;
}

Assistant:

bool FiniteModelMultiSorted::evaluateGroundLiteral(Literal* lit)
{
  ASS(lit->ground());

#if DEBUG_MODEL
  cout << "Evaluating ground literal " << lit->toString() << endl;
#endif

  // evaluate all arguments
  unsigned arity = env.signature->predicateArity(lit->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(lit->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+lit->toString()+
                    " on "+(lit->nthArgument(i)->term()->toString())+
                    ", probably a partial model");
  }

  if(lit->isEquality()){
    bool res = args[0]==args[1];
#if DEBUG_MODEL
    cout << "Evaluate equality, args " << args[0] << " and " << args[1] << endl;
    cout << "res is " << (lit->polarity() ? res : !res) << endl;
#endif
    if(lit->polarity()) return res;
    else return !res;
  }

  OperatorType* sig = env.signature->getPredicate(lit->functor())->predType();
  unsigned var = _p_offsets[lit->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }

#if VDEBUG
  if((lit->functor()+1)<_p_offsets.size()) ASS_L(var,_p_offsets[lit->functor()+1]);
#endif
  ASS_L(var,_p_interpretation.size());

  char res = _p_interpretation[var];
#if DEBUG_MODEL
    cout << "res is " << res << " and polarity is " << lit->polarity() << endl;
#endif

  if(res==INTP_UNDEF)
    USER_ERROR("Could not evaluate "+lit->toString()+", probably a partial model");

  return (res==INTP_TRUE) == (lit->polarity());
}